

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

Fl_Tree_Item * __thiscall Fl_Tree_Item::find_child_item(Fl_Tree_Item *this,char **arr)

{
  char **ppcVar1;
  Fl_Tree_Item **ppFVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  do {
    lVar5 = (long)(this->_children)._total;
    if (lVar5 < 1) {
      return (Fl_Tree_Item *)0x0;
    }
    ppFVar2 = (this->_children)._items;
    lVar4 = 0;
    while( true ) {
      this = ppFVar2[lVar4];
      if ((this->_label != (char *)0x0) && (iVar3 = strcmp(this->_label,*arr), iVar3 == 0)) break;
      lVar4 = lVar4 + 1;
      if (lVar5 == lVar4) {
        return (Fl_Tree_Item *)0x0;
      }
    }
    ppcVar1 = arr + 1;
    arr = arr + 1;
    if (*ppcVar1 == (char *)0x0) {
      return this;
    }
  } while( true );
}

Assistant:

const Fl_Tree_Item *Fl_Tree_Item::find_child_item(char **arr) const {
  for ( int t=0; t<children(); t++ ) {
    if ( child(t)->label() ) {
      if ( strcmp(child(t)->label(), *arr) == 0 ) {	// match?
        if ( *(arr+1) ) {				// more in arr? descend
          return(_children[t]->find_child_item(arr+1));
        } else {					// end of arr? done
          return(_children[t]);
        }
      }
    }
  }
  return(0);
}